

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::draw_text_yuv420sp
               (uchar *yuv420sp,int w,int h,char *text,int x,int y,int fontpixelsize,uint color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uchar *UV;
  uchar *Y;
  uchar *pen_color_uv;
  uchar *pen_color_y;
  uint v_uv;
  uint v_y;
  uchar *pen_color;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  int in_stack_ffffffffffffffb0;
  long lVar6;
  uint color_00;
  
  lVar6 = in_RDI;
  draw_text_c1((uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffffb0,(uint)in_RDI);
  color_00 = (uint)lVar6;
  lVar5 = in_RDI + in_ESI * in_EDX;
  iVar1 = in_ESI / 2;
  iVar2 = in_EDX / 2;
  iVar3 = in_R8D / 2;
  iVar4 = in_R9D / 2;
  local_54 = in_stack_00000008 / 2;
  local_58 = 1;
  lVar6 = lVar5;
  std::max<int>(&local_54,&local_58);
  draw_text_c2((uchar *)CONCAT44(iVar4,iVar3),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
               (char *)CONCAT44(iVar2,iVar1),(int)((ulong)lVar5 >> 0x20),(int)lVar5,(int)lVar6,
               color_00);
  return;
}

Assistant:

void draw_text_yuv420sp(unsigned char* yuv420sp, int w, int h, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    // assert w % 2 == 0
    // assert h % 2 == 0
    // assert x % 2 == 0
    // assert y % 2 == 0
    // assert fontpixelsize % 2 == 0

    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned int v_y;
    unsigned int v_uv;
    unsigned char* pen_color_y = (unsigned char*)&v_y;
    unsigned char* pen_color_uv = (unsigned char*)&v_uv;
    pen_color_y[0] = pen_color[0];
    pen_color_uv[0] = pen_color[1];
    pen_color_uv[1] = pen_color[2];

    unsigned char* Y = yuv420sp;
    draw_text_c1(Y, w, h, text, x, y, fontpixelsize, v_y);

    unsigned char* UV = yuv420sp + w * h;
    draw_text_c2(UV, w / 2, h / 2, text, x / 2, y / 2, std::max(fontpixelsize / 2, 1), v_uv);
}